

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.cpp
# Opt level: O0

void __thiscall ChaCha20Aligned::SetKey(ChaCha20Aligned *this,Span<const_std::byte> key)

{
  long lVar1;
  uint32_t uVar2;
  size_t sVar3;
  uchar *ptr;
  uint32_t *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  uchar *in_stack_ffffffffffffff60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = Span<const_std::byte>::size
                    ((Span<const_std::byte> *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (sVar3 != 0x20) {
    __assert_fail("key.size() == KEYLEN",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/chacha20.cpp"
                  ,0x1b,"void ChaCha20Aligned::SetKey(Span<const std::byte>)");
  }
  Span<const_std::byte>::data
            ((Span<const_std::byte> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
  ;
  UCharCast((byte *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  uVar2 = ReadLE32(in_stack_ffffffffffffff60);
  *in_RDI = uVar2;
  Span<const_std::byte>::data
            ((Span<const_std::byte> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
  ;
  UCharCast((byte *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  uVar2 = ReadLE32(in_stack_ffffffffffffff60);
  in_RDI[1] = uVar2;
  Span<const_std::byte>::data
            ((Span<const_std::byte> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
  ;
  UCharCast((byte *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  uVar2 = ReadLE32(in_stack_ffffffffffffff60);
  in_RDI[2] = uVar2;
  Span<const_std::byte>::data
            ((Span<const_std::byte> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
  ;
  UCharCast((byte *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  uVar2 = ReadLE32(in_stack_ffffffffffffff60);
  in_RDI[3] = uVar2;
  Span<const_std::byte>::data
            ((Span<const_std::byte> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
  ;
  UCharCast((byte *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  uVar2 = ReadLE32(in_stack_ffffffffffffff60);
  in_RDI[4] = uVar2;
  Span<const_std::byte>::data
            ((Span<const_std::byte> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
  ;
  UCharCast((byte *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  uVar2 = ReadLE32(in_stack_ffffffffffffff60);
  in_RDI[5] = uVar2;
  Span<const_std::byte>::data
            ((Span<const_std::byte> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
  ;
  UCharCast((byte *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  uVar2 = ReadLE32(in_stack_ffffffffffffff60);
  in_RDI[6] = uVar2;
  Span<const_std::byte>::data
            ((Span<const_std::byte> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
  ;
  ptr = UCharCast((byte *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  uVar2 = ReadLE32(ptr);
  in_RDI[7] = uVar2;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ChaCha20Aligned::SetKey(Span<const std::byte> key) noexcept
{
    assert(key.size() == KEYLEN);
    input[0] = ReadLE32(UCharCast(key.data() + 0));
    input[1] = ReadLE32(UCharCast(key.data() + 4));
    input[2] = ReadLE32(UCharCast(key.data() + 8));
    input[3] = ReadLE32(UCharCast(key.data() + 12));
    input[4] = ReadLE32(UCharCast(key.data() + 16));
    input[5] = ReadLE32(UCharCast(key.data() + 20));
    input[6] = ReadLE32(UCharCast(key.data() + 24));
    input[7] = ReadLE32(UCharCast(key.data() + 28));
    input[8] = 0;
    input[9] = 0;
    input[10] = 0;
    input[11] = 0;
}